

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O1

int __thiscall
CTPNStmEnclosing::gen_code_break_loop
          (CTPNStmEnclosing *this,CTcCodeLabel *code_label,textchar_t *lbl,size_t lbl_len)

{
  CTPNStmEnclosing *pCVar1;
  int iVar2;
  
  if (lbl == (textchar_t *)0x0) {
    CTcGenTarg::write_op(G_cg,0x91);
    CTcCodeStream::write_ofs(G_cs,code_label,0,0);
    return 1;
  }
  pCVar1 = this->enclosing_;
  if (pCVar1 != (CTPNStmEnclosing *)0x0) {
    iVar2 = (*(pCVar1->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
              _vptr_CTcPrsNodeBase[0x1f])(pCVar1,lbl,lbl_len);
    return iVar2;
  }
  return 0;
}

Assistant:

int CTPNStmEnclosing::gen_code_break_loop(CTcCodeLabel *code_label,
                                          const textchar_t *lbl,
                                          size_t lbl_len)
{
    /* 
     *   If the statement is labeled, let the enclosing statement handle
     *   it -- since it's labeled, we can't assume the statement refers to
     *   us without searching for the enclosing label.  
     */
    if (lbl != 0)
    {
        /* if there's an enclosing statement, let it handle it */
        if (enclosing_ != 0)
            return enclosing_->gen_code_break(lbl, lbl_len);

        /* 
         *   there's no enclosing statement, and we can't handle this
         *   because it has an explicit label attached - indicate that no
         *   break has been generated and give up 
         */
        return FALSE;
    }

    /* 
     *   It's unlabeled, so we can take it by default as the nearest
     *   enclosing statement for which 'break' makes sense -- generate the
     *   jump to the given code label.  
     */
    G_cg->write_op(OPC_JMP);
    G_cs->write_ofs2(code_label, 0);

    /* we have generated the break */
    return TRUE;
}